

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManAddNextEntry_rec(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode)

{
  int iVar1;
  int Num;
  Gia_Obj_t *pOld_00;
  Gia_Obj_t *pNode_local;
  Gia_Obj_t *pOld_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjId(p,pOld);
  iVar1 = Gia_ObjNext(p,iVar1);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjId(p,pOld);
    Num = Gia_ObjId(p,pNode);
    Gia_ObjSetNext(p,iVar1,Num);
  }
  else {
    iVar1 = Gia_ObjId(p,pOld);
    pOld_00 = Gia_ObjNextObj(p,iVar1);
    Gia_ManAddNextEntry_rec(p,pOld_00,pNode);
  }
  return;
}

Assistant:

void Gia_ManAddNextEntry_rec( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode )
{
    if ( Gia_ObjNext(p, Gia_ObjId(p, pOld)) == 0 )
    {
        Gia_ObjSetNext( p, Gia_ObjId(p, pOld), Gia_ObjId(p, pNode) );
        return;
    }
    Gia_ManAddNextEntry_rec( p, Gia_ObjNextObj(p, Gia_ObjId(p, pOld)), pNode );
}